

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O3

int CBinds::GetModifierMaskOfKey(int Key)

{
  int iVar1;
  
  iVar1 = 0;
  if (Key - 0x160U < 6) {
    iVar1 = *(int *)(&DAT_001d8854 + (ulong)(Key - 0x160U) * 4);
  }
  return iVar1;
}

Assistant:

int CBinds::GetModifierMaskOfKey(int Key)
{
	switch(Key)
	{
		case KEY_LSHIFT:
		case KEY_RSHIFT:
			return 1 << CBinds::MODIFIER_SHIFT;
		case KEY_LCTRL:
		case KEY_RCTRL:
			return 1 << CBinds::MODIFIER_CTRL;
		case KEY_LALT:
			return 1 << CBinds::MODIFIER_ALT;
		default:
			return 0;
	}
}